

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *objToStore,
               XSerializeEngine *serEng)

{
  bool bVar1;
  uint ui;
  XMLSize_t t;
  MemoryManager *pMVar2;
  void *key_00;
  XMLStringPool *pXVar3;
  XercesGroupInfo *serObj;
  XercesGroupInfo *data;
  uint id;
  XMLCh *key;
  XMLSize_t local_50;
  XMLSize_t itemNumber;
  RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> e;
  XSerializeEngine *serEng_local;
  RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *objToStore_local;
  
  e.fMemoryManager = (MemoryManager *)serEng;
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  pMVar2 = e.fMemoryManager;
  if (bVar1) {
    t = RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::getHashModulus
                  (objToStore);
    XSerializeEngine::writeSize((XSerializeEngine *)pMVar2,t);
    pMVar2 = RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
             getMemoryManager(objToStore);
    RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
    RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *)
               &itemNumber,objToStore,false,pMVar2);
    local_50 = 0;
    while (bVar1 = RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                   ::hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                                      *)&itemNumber), bVar1) {
      RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::nextElement
                ((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                  *)&itemNumber);
      local_50 = local_50 + 1;
    }
    XSerializeEngine::writeSize((XSerializeEngine *)e.fMemoryManager,local_50);
    RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::Reset
              ((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *)
               &itemNumber);
    while (bVar1 = RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                   ::hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                                      *)&itemNumber), bVar1) {
      key_00 = RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
               nextElementKey((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                               *)&itemNumber);
      pXVar3 = XSerializeEngine::getStringPool((XSerializeEngine *)e.fMemoryManager);
      ui = (*(pXVar3->super_XSerializable)._vptr_XSerializable[9])(pXVar3,key_00);
      XSerializeEngine::operator<<((XSerializeEngine *)e.fMemoryManager,ui);
      serObj = RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::get
                         (objToStore,key_00);
      operator<<((XSerializeEngine *)e.fMemoryManager,&serObj->super_XSerializable);
    }
    RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator
              ((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *)
               &itemNumber);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefHashTableOf<XercesGroupInfo>* const objToStore
                                    , XSerializeEngine&                      serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        serEng.writeSize (objToStore->getHashModulus());

        RefHashTableOfEnumerator<XercesGroupInfo> e(objToStore, false, objToStore->getMemoryManager());
        XMLSize_t itemNumber = 0;

        while (e.hasMoreElements())
        {
            e.nextElement();
            itemNumber++;
        }

        serEng.writeSize (itemNumber);
        e.Reset();

#ifdef XERCES_DEBUG_SORT_GRAMMAR
        //to sort the key
        SORT_KEYSET_ONEKEY(serEng.getMemoryManager())

        //to store the data
        for (XMLSize_t i=0; i < itemNumber; i++)
        {
            GET_NEXT_KEYSET()

            unsigned int id  = serEng.getStringPool()->getId(strKey);
            serEng<<id;

            XercesGroupInfo* data = objToStore->get(strKey);
            serEng<<data;
        }
#else
        while (e.hasMoreElements())
        {
            XMLCh*       key = (XMLCh*) e.nextElementKey();
            unsigned int id  = serEng.getStringPool()->getId(key);

           // key = StringPool->getValueForId(XercesGroupInfo::getNameSpaceId())
           //     + chComma
           //     + StringPool->getValueForId(XercesGroupInfo::getNameId())
           //
           // and the key is guranteed in the StringPool
           //
           //
           //  if (id == 0)
           //  {
           //      throw exception
           //   }
           //

            serEng<<id;

            XercesGroupInfo* data = objToStore->get(key);
            serEng<<data;
        }
#endif
    }
}